

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/external/Catch2/single_include/catch2/catch.hpp:9773:41)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_rabauke[P]trng4_external_Catch2_single_include_catch2_catch_hpp:9773:41)>
          *this,string *arg)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  When WVar5;
  string keypressLc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  long *local_e0;
  long local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  string local_c0;
  string local_a0;
  undefined **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_a0);
  WVar5 = Never;
  local_78 = 0;
  local_80 = &PTR__BasicResult_00318220;
  local_68 = 0;
  local_60[0] = 0;
  local_70 = local_60;
  toLower(&local_c0,&local_a0);
  iVar2 = ::std::__cxx11::string::compare((char *)&local_c0);
  if (iVar2 != 0) {
    iVar2 = ::std::__cxx11::string::compare((char *)&local_c0);
    if (iVar2 == 0) {
      WVar5 = BeforeStart;
    }
    else {
      iVar2 = ::std::__cxx11::string::compare((char *)&local_c0);
      if (iVar2 == 0) {
        WVar5 = BeforeExit;
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)&local_c0);
        if (iVar2 != 0) {
          ::std::operator+(&local_50,
                           "keypress argument must be one of: never, start, exit or both. \'",
                           &local_a0);
          plVar3 = (long *)::std::__cxx11::string::append((char *)&local_50);
          plVar4 = plVar3 + 2;
          if ((long *)*plVar3 == plVar4) {
            local_d0 = *plVar4;
            uStack_c8 = (undefined4)plVar3[3];
            uStack_c4 = *(undefined4 *)((long)plVar3 + 0x1c);
            local_e0 = &local_d0;
          }
          else {
            local_d0 = *plVar4;
            local_e0 = (long *)*plVar3;
          }
          lVar1 = plVar3[1];
          *plVar3 = (long)plVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
          super_ResultBase.m_type = RuntimeError;
          (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
          super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00318220;
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_errorMessage,local_e0,
                     lVar1 + (long)local_e0);
          if (local_e0 != &local_d0) {
            operator_delete(local_e0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          goto LAB_0013e9a2;
        }
        WVar5 = BeforeStartAndExit;
      }
    }
  }
  ((this->m_lambda).config)->waitForKeypress = WVar5;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00318220;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0013e9a2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_80 = &PTR__BasicResult_00318220;
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }